

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O0

AttrValue * bloaty::dwarf::AttrValue::ParseAttr(CU *cu,uint16_t form,string_view *data)

{
  string_view format;
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint uVar5;
  CompilationUnitSizes *pCVar6;
  unsigned_long uVar7;
  undefined8 in_RCX;
  uint16_t form_00;
  ushort in_DX;
  CU *in_RSI;
  AttrValue *in_RDI;
  uint16_t indirect_form;
  string_view *in_stack_fffffffffffffe18;
  CU *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int line;
  undefined4 in_stack_fffffffffffffe30;
  undefined2 in_stack_fffffffffffffe34;
  uint16_t in_stack_fffffffffffffe36;
  undefined2 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4a;
  undefined2 in_stack_fffffffffffffe4c;
  undefined2 in_stack_fffffffffffffe4e;
  undefined2 in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe52;
  undefined2 in_stack_fffffffffffffe54;
  undefined2 in_stack_fffffffffffffe56;
  undefined2 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5a;
  undefined2 in_stack_fffffffffffffe5c;
  undefined2 in_stack_fffffffffffffe5e;
  undefined1 local_120 [32];
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  undefined6 in_stack_ffffffffffffffe0;
  undefined6 in_stack_fffffffffffffff0;
  
  form_00 = (uint16_t)((ulong)in_RCX >> 0x30);
  uVar5 = (uint)in_DX;
  if (uVar5 != 1) {
    if (uVar5 == 3) {
      local_40 = ReadBlock<unsigned_short>((string_view *)in_stack_fffffffffffffe20);
      AttrValue(in_RDI,in_DX,local_40);
      return in_RDI;
    }
    if (uVar5 == 4) {
      local_50 = ReadBlock<unsigned_int>((string_view *)in_stack_fffffffffffffe20);
      AttrValue(in_RDI,in_DX,local_50);
      return in_RDI;
    }
    if (uVar5 == 5) {
      local_d0 = ReadBytes((size_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      AttrValue(in_RDI,in_DX,local_d0);
      return in_RDI;
    }
    if (uVar5 == 6) {
      local_e0 = ReadBytes((size_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      AttrValue(in_RDI,in_DX,local_e0);
      return in_RDI;
    }
    if (uVar5 == 7) {
      local_f0 = ReadBytes((size_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      AttrValue(in_RDI,in_DX,local_f0);
      return in_RDI;
    }
    if (uVar5 == 8) {
      local_70 = ReadNullTerminated((string_view *)0x21b1e7);
      AttrValue(in_RDI,in_DX,local_70);
      return in_RDI;
    }
    if (uVar5 == 9) {
LAB_0021b179:
      local_60 = ReadVariableBlock((string_view *)in_stack_fffffffffffffe20);
      AttrValue(in_RDI,in_DX,local_60);
      return in_RDI;
    }
    if (uVar5 == 10) {
      local_30 = ReadBlock<unsigned_char>((string_view *)in_stack_fffffffffffffe20);
      AttrValue(in_RDI,in_DX,local_30);
      return in_RDI;
    }
    if (uVar5 == 0xb) {
      local_c0 = ReadBytes((size_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      AttrValue(in_RDI,in_DX,local_c0);
      return in_RDI;
    }
    if (uVar5 == 0xc) {
      bVar1 = ReadFixed<unsigned_char,1ul>((string_view *)in_stack_fffffffffffffe20);
      AttrValue(in_RDI,in_DX,(ulong)bVar1);
      return in_RDI;
    }
    if (uVar5 == 0xd) {
      uVar7 = ReadLEB128<unsigned_long>
                        ((string_view *)
                         CONCAT26(in_stack_fffffffffffffe36,
                                  CONCAT24(in_DX,in_stack_fffffffffffffe30)));
      AttrValue(in_RDI,in_DX,uVar7);
      return in_RDI;
    }
    if (uVar5 == 0xe) {
      pCVar6 = CU::unit_sizes(in_RSI);
      bVar3 = CompilationUnitSizes::dwarf64(pCVar6);
      if (!bVar3) {
        local_90 = ReadIndirectString<unsigned_int>
                             (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        AttrValue(in_RDI,in_DX,local_90);
        return in_RDI;
      }
      local_80 = ReadIndirectString<unsigned_long>
                           (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      AttrValue(in_RDI,in_DX,local_80);
      return in_RDI;
    }
    if (uVar5 == 0xf) {
      uVar7 = ReadLEB128<unsigned_long>
                        ((string_view *)
                         CONCAT26(in_stack_fffffffffffffe36,
                                  CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)));
      AttrValue(in_RDI,in_DX,uVar7);
      return in_RDI;
    }
    if (uVar5 == 0x10) {
      pCVar6 = CU::unit_sizes(in_RSI);
      bVar1 = CompilationUnitSizes::dwarf_version(pCVar6);
      if (bVar1 < 3) goto LAB_0021aee6;
    }
    else {
      if (uVar5 == 0x11) {
        bVar1 = ReadFixed<unsigned_char,1ul>((string_view *)in_stack_fffffffffffffe20);
        AttrValue(in_RDI,in_DX,(ulong)bVar1);
        return in_RDI;
      }
      if (uVar5 == 0x12) {
        uVar4 = ReadFixed<unsigned_short,2ul>((string_view *)in_stack_fffffffffffffe20);
        AttrValue(in_RDI,in_DX,(ulong)uVar4);
        return in_RDI;
      }
      if (uVar5 == 0x13) {
        uVar5 = ReadFixed<unsigned_int,4ul>((string_view *)in_stack_fffffffffffffe20);
        AttrValue(in_RDI,in_DX,(ulong)uVar5);
        return in_RDI;
      }
      if (uVar5 == 0x14) {
LAB_0021ac8a:
        uVar7 = ReadFixed<unsigned_long,8ul>((string_view *)in_stack_fffffffffffffe20);
        AttrValue(in_RDI,in_DX,uVar7);
        return in_RDI;
      }
      if (uVar5 == 0x15) {
LAB_0021acbe:
        ReadFixed<unsigned_char,1ul>((string_view *)in_stack_fffffffffffffe20);
        UnresolvedString(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
        return in_RDI;
      }
      if (uVar5 == 0x16) {
        uVar4 = ReadLEB128<unsigned_short>
                          ((string_view *)
                           CONCAT26(in_stack_fffffffffffffe36,
                                    CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)));
        if (uVar4 != 0x16) {
          ParseAttr((CU *)CONCAT26(in_DX,in_stack_fffffffffffffff0),form_00,
                    (string_view *)CONCAT26(uVar4,in_stack_ffffffffffffffe0));
          return in_RDI;
        }
        Throw((char *)CONCAT26(in_stack_fffffffffffffe36,
                               CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      }
      if (uVar5 != 0x17) {
        if (uVar5 == 0x18) goto LAB_0021b179;
        if (uVar5 == 0x19) {
          AttrValue(in_RDI,in_DX,1);
          return in_RDI;
        }
        if (uVar5 != 0x1a) {
          if (uVar5 != 0x1b) {
            if (uVar5 == 0x1e) {
              local_100 = ReadBytes((size_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              AttrValue(in_RDI,in_DX,local_100);
              return in_RDI;
            }
            if (uVar5 == 0x1f) {
              pCVar6 = CU::unit_sizes(in_RSI);
              bVar3 = CompilationUnitSizes::dwarf64(pCVar6);
              if (!bVar3) {
                local_b0 = ReadIndirectLineString<unsigned_int>
                                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                AttrValue(in_RDI,in_DX,local_b0);
                return in_RDI;
              }
              local_a0 = ReadIndirectLineString<unsigned_long>
                                   (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              AttrValue(in_RDI,in_DX,local_a0);
              return in_RDI;
            }
            if (uVar5 == 0x20) goto LAB_0021ac8a;
            if (uVar5 == 0x21) {
              AttrValue(in_RDI,in_DX,1);
              return in_RDI;
            }
            if (uVar5 - 0x22 < 2) {
              uVar7 = ReadLEB128<unsigned_long>
                                ((string_view *)
                                 CONCAT26(in_stack_fffffffffffffe36,
                                          CONCAT24(in_stack_fffffffffffffe34,
                                                   in_stack_fffffffffffffe30)));
              AttrValue(in_RDI,in_DX,uVar7);
              return in_RDI;
            }
            if (uVar5 == 0x25) goto LAB_0021acbe;
            if (uVar5 == 0x26) {
              ReadFixed<unsigned_short,2ul>((string_view *)in_stack_fffffffffffffe20);
              UnresolvedString(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
              return in_RDI;
            }
            if (uVar5 == 0x27) {
              ReadFixed<unsigned_int,3ul>((string_view *)in_stack_fffffffffffffe20);
              UnresolvedString(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
              return in_RDI;
            }
            if (uVar5 == 0x28) {
              ReadFixed<unsigned_int,4ul>((string_view *)in_stack_fffffffffffffe20);
              UnresolvedString(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
              return in_RDI;
            }
            if (uVar5 == 0x29) {
              ReadFixed<unsigned_char,1ul>((string_view *)in_stack_fffffffffffffe20);
              UnresolvedUint(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
              return in_RDI;
            }
            if (uVar5 == 0x2a) {
              ReadFixed<unsigned_short,2ul>((string_view *)in_stack_fffffffffffffe20);
              UnresolvedUint(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
              return in_RDI;
            }
            if (uVar5 == 0x2b) {
              ReadFixed<unsigned_int,3ul>((string_view *)in_stack_fffffffffffffe20);
              UnresolvedUint(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
              return in_RDI;
            }
            if (uVar5 == 0x2c) {
              ReadFixed<unsigned_int,4ul>((string_view *)in_stack_fffffffffffffe20);
              UnresolvedUint(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
              return in_RDI;
            }
            if (uVar5 != 0x1f01) {
              if (uVar5 != 0x1f02) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT26(in_stack_fffffffffffffe36,
                                    CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
                           in_stack_fffffffffffffe28);
                absl::substitute_internal::Arg::Arg
                          ((Arg *)CONCAT26(in_stack_fffffffffffffe36,
                                           CONCAT24(in_stack_fffffffffffffe34,
                                                    in_stack_fffffffffffffe30)),
                           (unsigned_short)((ulong)in_stack_fffffffffffffe28 >> 0x30));
                line = (int)((ulong)local_120 >> 0x20);
                format._M_len._2_2_ = in_stack_fffffffffffffe52;
                format._M_len._0_2_ = in_stack_fffffffffffffe50;
                format._M_len._4_2_ = in_stack_fffffffffffffe54;
                format._M_len._6_2_ = in_stack_fffffffffffffe56;
                format._M_str._0_2_ = in_stack_fffffffffffffe58;
                format._M_str._2_2_ = in_stack_fffffffffffffe5a;
                format._M_str._4_2_ = in_stack_fffffffffffffe5c;
                format._M_str._6_2_ = in_stack_fffffffffffffe5e;
                absl::Substitute_abi_cxx11_
                          (format,(Arg *)CONCAT26(in_stack_fffffffffffffe4e,
                                                  CONCAT24(in_stack_fffffffffffffe4c,
                                                           CONCAT22(in_stack_fffffffffffffe4a,
                                                                    in_stack_fffffffffffffe48))));
                std::__cxx11::string::c_str();
                Throw((char *)CONCAT26(in_stack_fffffffffffffe36,
                                       CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                                      ),line);
              }
              goto LAB_0021ad9d;
            }
          }
          ReadLEB128<unsigned_long>
                    ((string_view *)
                     CONCAT26(in_stack_fffffffffffffe36,
                              CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)));
          UnresolvedUint(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
          return in_RDI;
        }
LAB_0021ad9d:
        ReadLEB128<unsigned_long>
                  ((string_view *)
                   CONCAT26(in_stack_fffffffffffffe36,
                            CONCAT24(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)));
        UnresolvedString(in_stack_fffffffffffffe36,(uint64_t)in_stack_fffffffffffffe28);
        return in_RDI;
      }
    }
    pCVar6 = CU::unit_sizes(in_RSI);
    bVar3 = CompilationUnitSizes::dwarf64(pCVar6);
    if (bVar3) {
      uVar7 = ReadFixed<unsigned_long,8ul>((string_view *)in_stack_fffffffffffffe20);
      AttrValue(in_RDI,in_DX,uVar7);
    }
    else {
      uVar5 = ReadFixed<unsigned_int,4ul>((string_view *)in_stack_fffffffffffffe20);
      AttrValue(in_RDI,in_DX,(ulong)uVar5);
    }
    return in_RDI;
  }
LAB_0021aee6:
  pCVar6 = CU::unit_sizes(in_RSI);
  uVar2 = CompilationUnitSizes::address_size(pCVar6);
  if (uVar2 == '\x04') {
    uVar5 = ReadFixed<unsigned_int,4ul>((string_view *)in_stack_fffffffffffffe20);
    AttrValue(in_RDI,in_DX,(ulong)uVar5);
    return in_RDI;
  }
  if (uVar2 == '\b') {
    uVar7 = ReadFixed<unsigned_long,8ul>((string_view *)in_stack_fffffffffffffe20);
    AttrValue(in_RDI,in_DX,uVar7);
    return in_RDI;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/dwarf/attr.cc"
                ,0xb1,
                "static AttrValue bloaty::dwarf::AttrValue::ParseAttr(const CU &, uint16_t, string_view *)"
               );
}

Assistant:

AttrValue AttrValue::ParseAttr(const CU& cu, uint16_t form, string_view* data) {
  switch (form) {
    case DW_FORM_indirect: {
      uint16_t indirect_form = ReadLEB128<uint16_t>(data);
      if (indirect_form == DW_FORM_indirect) {
        THROW("indirect attribute has indirect form type");
      }
      return ParseAttr(cu, indirect_form, data);
    }
    case DW_FORM_ref1:
      return AttrValue(form, ReadFixed<uint8_t>(data));
    case DW_FORM_ref2:
      return AttrValue(form, ReadFixed<uint16_t>(data));
    case DW_FORM_ref4:
      return AttrValue(form, ReadFixed<uint32_t>(data));
    case DW_FORM_ref_sig8:
    case DW_FORM_ref8:
      return AttrValue(form, ReadFixed<uint64_t>(data));
    case DW_FORM_ref_udata:
    case DW_FORM_strx1:
      return AttrValue::UnresolvedString(form, ReadFixed<uint8_t>(data));
    case DW_FORM_strx2:
      return AttrValue::UnresolvedString(form, ReadFixed<uint16_t>(data));
    case DW_FORM_strx3:
      return AttrValue::UnresolvedString(form, ReadFixed<uint32_t, 3>(data));
    case DW_FORM_strx4:
      return AttrValue::UnresolvedString(form, ReadFixed<uint32_t>(data));
    case DW_FORM_strx:
    case DW_FORM_GNU_str_index:
      return AttrValue::UnresolvedString(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_addrx1:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint8_t>(data));
    case DW_FORM_addrx2:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint16_t>(data));
    case DW_FORM_addrx3:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint32_t, 3>(data));
    case DW_FORM_addrx4:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint32_t>(data));
    case DW_FORM_addrx:
    case DW_FORM_GNU_addr_index:
      return AttrValue::UnresolvedUint(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_addr:
    address_size:
      switch (cu.unit_sizes().address_size()) {
        case 4:
          return AttrValue(form, ReadFixed<uint32_t>(data));
        case 8:
          return AttrValue(form, ReadFixed<uint64_t>(data));
        default:
          BLOATY_UNREACHABLE();
      }
    case DW_FORM_ref_addr:
      if (cu.unit_sizes().dwarf_version() <= 2) {
        goto address_size;
      }
      ABSL_FALLTHROUGH_INTENDED;
    case DW_FORM_sec_offset:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadFixed<uint64_t>(data));
      } else {
        return AttrValue(form, ReadFixed<uint32_t>(data));
      }
    case DW_FORM_udata:
      return AttrValue(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_block1:
      return AttrValue(form, ReadBlock<uint8_t>(data));
    case DW_FORM_block2:
      return AttrValue(form, ReadBlock<uint16_t>(data));
    case DW_FORM_block4:
      return AttrValue(form, ReadBlock<uint32_t>(data));
    case DW_FORM_block:
    case DW_FORM_exprloc:
      return AttrValue(form, ReadVariableBlock(data));
    case DW_FORM_string:
      return AttrValue(form, ReadNullTerminated(data));
    case DW_FORM_strp:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadIndirectString<uint64_t>(cu, data));
      } else {
        return AttrValue(form, ReadIndirectString<uint32_t>(cu, data));
      }
    case DW_FORM_line_strp:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadIndirectLineString<uint64_t>(cu, data));
      } else {
        return AttrValue(form, ReadIndirectLineString<uint32_t>(cu, data));
      }
    case DW_FORM_data1:
      return AttrValue(form, ReadBytes(1, data));
    case DW_FORM_data2:
      return AttrValue(form, ReadBytes(2, data));
    case DW_FORM_data4:
      return AttrValue(form, ReadBytes(4, data));
    case DW_FORM_data8:
      return AttrValue(form, ReadBytes(8, data));
    case DW_FORM_data16:
      return AttrValue(form, ReadBytes(16, data));
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
      return AttrValue(form, ReadLEB128<uint64_t>(data));

    // Bloaty doesn't currently care about any bool or signed data.
    // So we fudge it a bit and just stuff these in a uint64.
    case DW_FORM_flag_present:
      return AttrValue(form, 1);
    case DW_FORM_flag:
      return AttrValue(form, ReadFixed<uint8_t>(data));
    case DW_FORM_sdata:
      return AttrValue(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_implicit_const:
      return AttrValue(form, 1);
    default:
      THROWF("Don't know how to parse DWARF form: $0", form);
  }
}